

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O3

void http_connect(curl_socket_t *infdp,curl_socket_t rootfd,char *ipaddr,unsigned_short ipport)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  byte bVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined4 in_register_00000034;
  char *pcVar16;
  long lVar17;
  size_t sVar18;
  byte bVar19;
  bool bVar20;
  bool bVar21;
  _Bool poll_server_wr [2];
  _Bool poll_client_wr [2];
  _Bool poll_server_rd [2];
  _Bool poll_client_rd [2];
  curl_socket_t clientfd [2];
  curl_socket_t serverfd [2];
  ssize_t tos [2];
  ssize_t toc [2];
  curl_socklen_t flag;
  timeval timeout;
  fd_set input;
  fd_set output;
  char readserver [2] [256];
  char readclient [2] [256];
  httprequest req2;
  byte abStack_25030 [8];
  long lStack_25028;
  uint uStack_2501c;
  uint auStack_25018 [4];
  ulong uStack_25008;
  ulong uStack_25000;
  size_t asStack_24ff8 [5];
  char *pcStack_24fd0;
  ulong uStack_24fc8;
  undefined4 uStack_24fbc;
  long lStack_24fb8;
  ulong uStack_24fb0;
  char *pcStack_24fa8;
  curl_socket_t *pcStack_24fa0;
  timeval tStack_24f98;
  fd_set fStack_24f88;
  fd_set fStack_24f08;
  char acStack_24e88 [512];
  char acStack_24c88 [520];
  httprequest hStack_24a80;
  
  pcStack_24fa8 = ipaddr;
  uStack_24fc8 = CONCAT44(in_register_00000034,rootfd);
  auStack_25018[2] = -1;
  auStack_25018[3] = 0xffffffff;
  asStack_24ff8[2] = 0;
  asStack_24ff8[3] = 0;
  asStack_24ff8[0] = 0;
  asStack_24ff8[1] = 0;
  abStack_25030[6] = 1;
  abStack_25030[7] = 1;
  abStack_25030[4] = 1;
  abStack_25030[5] = 1;
  abStack_25030[2] = 1;
  abStack_25030[3] = 1;
  abStack_25030[0] = 1;
  abStack_25030[1] = 1;
  pcStack_24fa0 = infdp;
  auStack_25018[1] = 0xffffffff;
  auStack_25018[0] = *infdp;
  uVar13 = 3;
  do {
    if (got_exit_signal != 0) break;
    wait_ms(0xfa);
    uVar13 = uVar13 - 1;
  } while (1 < uVar13);
  if (got_exit_signal == 0) {
    auStack_25018[2] = connect_to(pcStack_24fa8,ipport);
    if (auStack_25018[2] != -1) {
      iVar4 = (int)uStack_24fc8;
      iVar3 = iVar4 + 0x3f;
      if (-1 < iVar4) {
        iVar3 = iVar4;
      }
      uStack_24fb0 = 1L << ((byte)uStack_24fc8 & 0x3f);
      lStack_24fb8 = (long)(iVar3 >> 6);
      uStack_25008 = 0;
      uStack_2501c = 0;
LAB_00107a3b:
      bVar21 = (auStack_25018[3] & auStack_25018[1]) == 0xffffffff;
      if (got_exit_signal == 0) {
        iVar4 = (int)uStack_25008;
        bVar11 = abStack_25030[6] ^ 1;
        bVar10 = abStack_25030[2] ^ 1;
        bVar2 = abStack_25030[4] ^ 1;
        bVar19 = abStack_25030[0] ^ 1;
        uVar13 = 0;
        do {
          tStack_24f98.tv_sec = 1;
          tStack_24f98.tv_usec = 0;
          fStack_24f88.fds_bits[0] = 0;
          fStack_24f88.fds_bits[1] = 0;
          fStack_24f88.fds_bits[2] = 0;
          fStack_24f88.fds_bits[3] = 0;
          fStack_24f88.fds_bits[4] = 0;
          fStack_24f88.fds_bits[5] = 0;
          fStack_24f88.fds_bits[6] = 0;
          fStack_24f88.fds_bits[7] = 0;
          fStack_24f88.fds_bits[8] = 0;
          fStack_24f88.fds_bits[9] = 0;
          fStack_24f88.fds_bits[10] = 0;
          fStack_24f88.fds_bits[0xb] = 0;
          fStack_24f88.fds_bits[0xc] = 0;
          fStack_24f88.fds_bits[0xd] = 0;
          fStack_24f88.fds_bits[0xe] = 0;
          fStack_24f88.fds_bits[0xf] = 0;
          fStack_24f08.fds_bits[0] = 0;
          fStack_24f08.fds_bits[1] = 0;
          fStack_24f08.fds_bits[2] = 0;
          fStack_24f08.fds_bits[3] = 0;
          fStack_24f08.fds_bits[4] = 0;
          fStack_24f08.fds_bits[5] = 0;
          fStack_24f08.fds_bits[6] = 0;
          fStack_24f08.fds_bits[7] = 0;
          fStack_24f08.fds_bits[8] = 0;
          fStack_24f08.fds_bits[9] = 0;
          fStack_24f08.fds_bits[10] = 0;
          fStack_24f08.fds_bits[0xb] = 0;
          fStack_24f08.fds_bits[0xc] = 0;
          fStack_24f08.fds_bits[0xd] = 0;
          fStack_24f08.fds_bits[0xe] = 0;
          fStack_24f08.fds_bits[0xf] = 0;
          uVar12 = 0xffffffff;
          if (((bVar19 | bVar2 | bVar10 | bVar11) & 1) == 0 && bVar21) {
            fStack_24f88.fds_bits[lStack_24fb8] = fStack_24f88.fds_bits[lStack_24fb8] | uStack_24fb0
            ;
            uVar12 = uStack_24fc8 & 0xffffffff;
          }
          uVar5 = 0;
          do {
            uVar14 = auStack_25018[uVar5];
            if (uVar14 != 0xffffffff) {
              if (abStack_25030[uVar5 + 6] == 1) {
                uVar15 = uVar14 + 0x3f;
                if (-1 < (int)uVar14) {
                  uVar15 = uVar14;
                }
                fStack_24f88.fds_bits[(int)uVar15 >> 6] =
                     fStack_24f88.fds_bits[(int)uVar15 >> 6] | 1L << ((byte)uVar14 & 0x3f);
                if ((int)uVar12 < (int)uVar14) {
                  uVar12 = (ulong)uVar14;
                }
              }
              if ((abStack_25030[uVar5 + 2] == 1) && (asStack_24ff8[uVar5 + 2] != 0)) {
                uVar15 = uVar14 + 0x3f;
                if (-1 < (int)uVar14) {
                  uVar15 = uVar14;
                }
                fStack_24f08.fds_bits[(int)uVar15 >> 6] =
                     fStack_24f08.fds_bits[(int)uVar15 >> 6] | 1L << ((byte)uVar14 & 0x3f);
                if ((int)uVar14 <= (int)(uint)uVar12) {
                  uVar14 = (uint)uVar12;
                }
                uVar12 = (ulong)uVar14;
              }
            }
            uVar14 = auStack_25018[uVar5 + 2];
            if (uVar14 != 0xffffffff) {
              uVar1 = uVar12;
              if (abStack_25030[uVar5 + 4] == 1) {
                uVar15 = uVar14 + 0x3f;
                if (-1 < (int)uVar14) {
                  uVar15 = uVar14;
                }
                fStack_24f88.fds_bits[(int)uVar15 >> 6] =
                     fStack_24f88.fds_bits[(int)uVar15 >> 6] | 1L << ((byte)uVar14 & 0x3f);
                uVar1 = (ulong)uVar14;
                if ((int)uVar14 <= (int)uVar12) {
                  uVar1 = uVar12;
                }
              }
              uVar12 = uVar1;
              if ((abStack_25030[uVar5] == 1) && (asStack_24ff8[uVar5] != 0)) {
                uVar15 = uVar14 + 0x3f;
                if (-1 < (int)uVar14) {
                  uVar15 = uVar14;
                }
                fStack_24f08.fds_bits[(int)uVar15 >> 6] =
                     fStack_24f08.fds_bits[(int)uVar15 >> 6] | 1L << ((byte)uVar14 & 0x3f);
                if ((int)uVar14 <= (int)(uint)uVar12) {
                  uVar14 = (uint)uVar12;
                }
                uVar12 = (ulong)uVar14;
              }
            }
            uVar5 = uVar5 + 1;
          } while (iVar4 + 1 != uVar5);
          if (got_exit_signal != 0) break;
          do {
            iVar3 = select((int)uVar12 + 1,&fStack_24f88,&fStack_24f08,(fd_set *)0x0,&tStack_24f98);
            if ((-1 < iVar3) || (piVar6 = __errno_location(), *piVar6 != 4)) break;
          } while (got_exit_signal == 0);
          if (got_exit_signal != 0) break;
          if (0 < iVar3) goto LAB_00107cca;
          bVar20 = 4 < uVar13;
          uVar13 = uVar13 + 1;
          if (bVar20) {
            logmsg("CONNECT proxy timeout after %d idle seconds!");
            break;
          }
        } while( true );
      }
    }
  }
LAB_0010790a:
  lVar17 = 4;
  do {
    iVar4 = *(int *)((long)auStack_25018 + lVar17 + 8);
    if (iVar4 == -1) {
      iVar4 = *(int *)((long)auStack_25018 + lVar17);
      if (iVar4 != -1) goto LAB_00107973;
    }
    else {
      pcVar16 = "DATA";
      if (lVar17 == 0) {
        pcVar16 = "CTRL";
      }
      logmsg("[%s] CLOSING server socket (cleanup)",pcVar16);
      shutdown(iVar4,2);
      close(iVar4);
      iVar4 = *(int *)((long)auStack_25018 + lVar17);
      if (iVar4 != -1) {
LAB_00107973:
        pcVar16 = "DATA";
        if (lVar17 == 0) {
          pcVar16 = "CTRL";
        }
        logmsg("[%s] CLOSING client socket (cleanup)",pcVar16);
        shutdown(iVar4,2);
        close(iVar4);
      }
      logmsg("[%s] ABORTING",pcVar16);
    }
    lVar17 = lVar17 + -4;
    if (lVar17 == -4) {
      *pcStack_24fa0 = -1;
      return;
    }
  } while( true );
LAB_00107cca:
  if ((bVar21) && ((fStack_24f88.fds_bits[lStack_24fb8] & uStack_24fb0) != 0)) {
    iVar4 = accept((int)uStack_24fc8,(sockaddr *)0x0,(socklen_t *)0x0);
    if (iVar4 != -1) {
      memset(&hStack_24a80,0,0x24a50);
      logmsg("====> Client connect DATA");
      if ((socket_domain + DOCNUMBER_WERULEZ & 0xfffffff7U) == 0) {
        uStack_24fbc = 1;
        iVar3 = setsockopt(iVar4,6,1,&uStack_24fbc,4);
        if (iVar3 != 0) {
          logmsg("====> TCP_NODELAY for client DATA connection failed");
        }
      }
      do {
        iVar3 = get_request(iVar4,&hStack_24a80);
      } while (-1 < iVar3);
      shutdown(iVar4,2);
      close(iVar4);
    }
    if (got_exit_signal != 0) goto LAB_0010790a;
  }
  uStack_25008 = (ulong)((int)uStack_25008 + 1);
  lVar17 = 0;
  uVar12 = 0;
  uStack_25000 = 0;
  do {
    uVar13 = auStack_25018[uVar12];
    if (uVar13 != 0xffffffff) {
      sVar18 = asStack_24ff8[uVar12];
      if (sVar18 - 0x100 != 0) {
        uVar14 = uVar13 + 0x3f;
        if (-1 < (int)uVar13) {
          uVar14 = uVar13;
        }
        if (((ulong)fStack_24f88.fds_bits[(int)uVar14 >> 6] >> ((ulong)uVar13 & 0x3f) & 1) != 0) {
          lStack_25028 = lVar17;
          sVar7 = recv(uVar13,acStack_24c88 + lVar17 + sVar18,-(sVar18 - 0x100),0);
          pcVar16 = "DATA";
          if (uVar12 == 0) {
            pcVar16 = "CTRL";
          }
          if ((long)sVar7 < 1) {
            logmsg("[%s] got %zd, STOP READING client",pcVar16,sVar7);
            shutdown(uVar13,0);
            abStack_25030[uVar12 + 6] = 0;
            lVar17 = lStack_25028;
          }
          else {
            logmsg("[%s] READ %zd bytes from client",pcVar16,sVar7);
            pcVar8 = data_to_hex(acStack_24c88 + lVar17 + sVar18,sVar7);
            logmsg("[%s] READ \"%s\"",pcVar16,pcVar8);
            asStack_24ff8[uVar12] = sVar7 + sVar18;
            lVar17 = lStack_25028;
          }
        }
      }
    }
    uVar14 = auStack_25018[uVar12 + 2];
    if (uVar14 != 0xffffffff) {
      sVar18 = asStack_24ff8[uVar12 + 2];
      if (sVar18 - 0x100 != 0) {
        uVar15 = uVar14 + 0x3f;
        if (-1 < (int)uVar14) {
          uVar15 = uVar14;
        }
        if (((ulong)fStack_24f88.fds_bits[(int)uVar15 >> 6] >> ((ulong)uVar14 & 0x3f) & 1) != 0) {
          pcStack_24fd0 = acStack_24e88 + lVar17 + sVar18;
          lStack_25028 = lVar17;
          sVar7 = recv(uVar14,pcStack_24fd0,-(sVar18 - 0x100),0);
          pcVar16 = "DATA";
          if (uVar12 == 0) {
            pcVar16 = "CTRL";
          }
          if ((long)sVar7 < 1) {
            logmsg("[%s] got %zd, STOP READING server",pcVar16,sVar7);
            shutdown(uVar14,0);
            abStack_25030[uVar12 + 4] = 0;
            lVar17 = lStack_25028;
          }
          else {
            logmsg("[%s] READ %zd bytes from server",pcVar16,sVar7);
            pcVar8 = data_to_hex(pcStack_24fd0,sVar7);
            logmsg("[%s] READ \"%s\"",pcVar16,pcVar8);
            asStack_24ff8[uVar12 + 2] = sVar7 + sVar18;
            lVar17 = lStack_25028;
          }
        }
      }
    }
    if ((uVar13 != 0xffffffff) && (sVar18 = asStack_24ff8[uVar12 + 2], sVar18 != 0)) {
      uVar15 = uVar13 + 0x3f;
      if (-1 < (int)uVar13) {
        uVar15 = uVar13;
      }
      if (((ulong)fStack_24f08.fds_bits[(int)uVar15 >> 6] >> ((ulong)uVar13 & 0x3f) & 1) != 0) {
        pcStack_24fd0 = acStack_24e88 + lVar17;
        lStack_25028 = lVar17;
        sVar7 = send(uVar13,pcStack_24fd0,sVar18,0x4000);
        pcVar16 = "DATA";
        if (uVar12 == 0) {
          pcVar16 = "CTRL";
        }
        if ((long)sVar7 < 1) {
          logmsg("[%s] got %zd, STOP WRITING client",pcVar16,sVar7);
          iVar4 = shutdown(uVar13,1);
          abStack_25030[uVar12 + 2] = 0;
          uStack_25000 = CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
          lVar17 = lStack_25028;
        }
        else {
          logmsg("[%s] SENT %zd bytes to client",pcVar16,sVar7);
          pcVar8 = pcStack_24fd0;
          pcVar9 = data_to_hex(pcStack_24fd0,sVar7);
          logmsg("[%s] SENT \"%s\"",pcVar16,pcVar9);
          sVar18 = sVar18 - sVar7;
          if (sVar18 == 0) {
            sVar18 = 0;
          }
          else {
            memmove(pcVar8,acStack_24e88 + lStack_25028 + sVar7,sVar18);
          }
          asStack_24ff8[uVar12 + 2] = sVar18;
          lVar17 = lStack_25028;
        }
      }
    }
    if ((uVar14 != 0xffffffff) && (sVar18 = asStack_24ff8[uVar12], sVar18 != 0)) {
      uVar13 = uVar14 + 0x3f;
      if (-1 < (int)uVar14) {
        uVar13 = uVar14;
      }
      if (((ulong)fStack_24f08.fds_bits[(int)uVar13 >> 6] >> ((ulong)uVar14 & 0x3f) & 1) != 0) {
        pcVar8 = acStack_24c88 + lVar17;
        lStack_25028 = lVar17;
        sVar7 = send(uVar14,pcVar8,sVar18,0x4000);
        pcVar16 = "DATA";
        if (uVar12 == 0) {
          pcVar16 = "CTRL";
        }
        if ((long)sVar7 < 1) {
          logmsg("[%s] got %zd, STOP WRITING server",pcVar16,sVar7);
          iVar4 = shutdown(uVar14,1);
          abStack_25030[uVar12] = 0;
          uStack_25000 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar4) >> 8),1);
          lVar17 = lStack_25028;
        }
        else {
          logmsg("[%s] SENT %zd bytes to server",pcVar16,sVar7);
          pcVar9 = data_to_hex(pcVar8,sVar7);
          logmsg("[%s] SENT \"%s\"",pcVar16,pcVar9);
          lVar17 = lStack_25028;
          sVar18 = sVar18 - sVar7;
          if (sVar18 == 0) {
            sVar18 = 0;
          }
          else {
            memmove(pcVar8,acStack_24c88 + lStack_25028 + sVar7,sVar18);
          }
          asStack_24ff8[uVar12] = sVar18;
        }
      }
    }
    uVar12 = uVar12 + 1;
    lVar17 = lVar17 + 0x100;
  } while (uStack_25008 != uVar12);
  if (got_exit_signal != 0) goto LAB_0010790a;
  uVar12 = 0;
  do {
    uVar13 = auStack_25018[uVar12];
    pcVar16 = "DATA";
    if (uVar12 == 0) {
      pcVar16 = "CTRL";
    }
    uVar14 = 3;
    do {
      if (uVar13 != 0xffffffff) {
        if ((abStack_25030[uVar12 + 6] == 1) && (abStack_25030[uVar12] == 0)) {
          logmsg("[%s] DISABLED READING client");
          shutdown(uVar13,0);
          abStack_25030[uVar12 + 6] = 0;
        }
        if (((abStack_25030[uVar12 + 2] == 1) && (abStack_25030[uVar12 + 4] == 0)) &&
           (asStack_24ff8[uVar12 + 2] == 0)) {
          logmsg("[%s] DISABLED WRITING client",pcVar16);
          iVar4 = shutdown(uVar13,1);
          abStack_25030[uVar12 + 2] = 0;
          uStack_25000 = CONCAT71((int7)(CONCAT44(extraout_var_01,iVar4) >> 8),1);
        }
      }
      uVar15 = auStack_25018[uVar12 + 2];
      if (uVar15 != 0xffffffff) {
        if ((abStack_25030[uVar12 + 4] == 1) && (abStack_25030[uVar12 + 2] == 0)) {
          logmsg("[%s] DISABLED READING server");
          shutdown(uVar15,0);
          abStack_25030[uVar12 + 4] = 0;
        }
        if (((abStack_25030[uVar12] == 1) && (abStack_25030[uVar12 + 6] == 0)) &&
           (asStack_24ff8[uVar12] == 0)) {
          logmsg("[%s] DISABLED WRITING server",pcVar16);
          iVar4 = shutdown(uVar15,1);
          abStack_25030[uVar12] = 0;
          uStack_25000 = CONCAT71((int7)(CONCAT44(extraout_var_02,iVar4) >> 8),1);
        }
      }
      uVar14 = uVar14 - 1;
    } while (1 < uVar14);
    uVar12 = uVar12 + 1;
  } while (uVar12 != uStack_25008);
  if ((uStack_25000 & 1) != 0) {
    wait_ms(0xfa);
  }
  bVar21 = true;
  uVar12 = 0;
  do {
    uVar13 = auStack_25018[uVar12];
    pcVar16 = "DATA";
    if (uVar12 == 0) {
      pcVar16 = "CTRL";
    }
    uVar14 = 3;
    do {
      if (uVar13 == 0xffffffff) {
LAB_0010849f:
        uVar13 = 0xffffffff;
LAB_001084a5:
        uVar15 = auStack_25018[uVar12 + 2];
        if (uVar15 != 0xffffffff) goto LAB_001084b0;
      }
      else {
        if ((abStack_25030[uVar12 + 2] != 0) || (abStack_25030[uVar12 + 6] != 0)) goto LAB_001084a5;
        logmsg("[%s] CLOSING client socket",pcVar16);
        close(uVar13);
        uVar15 = auStack_25018[uVar12 + 2];
        uVar13 = 0xffffffff;
        if (uVar15 == 0xffffffff) {
          logmsg("[%s] ENDING",pcVar16);
          uStack_2501c = uStack_2501c & 0xff;
          if (uVar12 == 1) {
            uStack_2501c = 0;
          }
          bVar21 = (bool)(bVar21 & uVar12 == 1);
          goto LAB_0010849f;
        }
LAB_001084b0:
        if ((abStack_25030[uVar12] == 0) && (abStack_25030[uVar12 + 4] == 0)) {
          logmsg("[%s] CLOSING server socket",pcVar16);
          close(uVar15);
          auStack_25018[uVar12 + 2] = 0xffffffff;
          if (uVar13 == 0xffffffff) {
            logmsg("[%s] ENDING",pcVar16);
            uStack_2501c = uStack_2501c & 0xff;
            if (uVar12 == 1) {
              uStack_2501c = 0;
            }
            bVar21 = (bool)(bVar21 & uVar12 == 1);
            uVar13 = 0xffffffff;
          }
        }
      }
      uVar14 = uVar14 - 1;
    } while (1 < uVar14);
    auStack_25018[uVar12] = uVar13;
    uVar12 = uVar12 + 1;
  } while (uVar12 != uStack_25008);
  uStack_25008 = (ulong)((byte)uStack_2501c & 1);
  if (!bVar21) goto LAB_0010790a;
  goto LAB_00107a3b;
}

Assistant:

static void http_connect(curl_socket_t *infdp,
                         curl_socket_t rootfd,
                         const char *ipaddr,
                         unsigned short ipport)
{
  curl_socket_t serverfd[2] = {CURL_SOCKET_BAD, CURL_SOCKET_BAD};
  curl_socket_t clientfd[2] = {CURL_SOCKET_BAD, CURL_SOCKET_BAD};
  ssize_t toc[2] = {0, 0}; /* number of bytes to client */
  ssize_t tos[2] = {0, 0}; /* number of bytes to server */
  char readclient[2][256];
  char readserver[2][256];
  bool poll_client_rd[2] = { TRUE, TRUE };
  bool poll_server_rd[2] = { TRUE, TRUE };
  bool poll_client_wr[2] = { TRUE, TRUE };
  bool poll_server_wr[2] = { TRUE, TRUE };
  bool primary = FALSE;
  bool secondary = FALSE;
  int max_tunnel_idx; /* CTRL or DATA */
  int loop;
  int i;
  int timeout_count = 0;

  /* primary tunnel client endpoint already connected */
  clientfd[CTRL] = *infdp;

  /* Sleep here to make sure the client reads CONNECT response's
     'end of headers' separate from the server data that follows.
     This is done to prevent triggering libcurl known bug #39. */
  for(loop = 2; (loop > 0) && !got_exit_signal; loop--)
    wait_ms(250);
  if(got_exit_signal)
    goto http_connect_cleanup;

  serverfd[CTRL] = connect_to(ipaddr, ipport);
  if(serverfd[CTRL] == CURL_SOCKET_BAD)
    goto http_connect_cleanup;

  /* Primary tunnel socket endpoints are now connected. Tunnel data back and
     forth over the primary tunnel until client or server breaks the primary
     tunnel, simultaneously allowing establishment, operation and teardown of
     a secondary tunnel that may be used for passive FTP data connection. */

  max_tunnel_idx = CTRL;
  primary = TRUE;

  while(!got_exit_signal) {

    fd_set input;
    fd_set output;
    struct timeval timeout = {1, 0}; /* 1000 ms */
    ssize_t rc;
    curl_socket_t maxfd = (curl_socket_t)-1;

    FD_ZERO(&input);
    FD_ZERO(&output);

    if((clientfd[DATA] == CURL_SOCKET_BAD) &&
       (serverfd[DATA] == CURL_SOCKET_BAD) &&
       poll_client_rd[CTRL] && poll_client_wr[CTRL] &&
       poll_server_rd[CTRL] && poll_server_wr[CTRL]) {
      /* listener socket is monitored to allow client to establish
         secondary tunnel only when this tunnel is not established
         and primary one is fully operational */
      FD_SET(rootfd, &input);
      maxfd = rootfd;
    }

    /* set tunnel sockets to wait for */
    for(i = 0; i <= max_tunnel_idx; i++) {
      /* client side socket monitoring */
      if(clientfd[i] != CURL_SOCKET_BAD) {
        if(poll_client_rd[i]) {
          /* unless told not to do so, monitor readability */
          FD_SET(clientfd[i], &input);
          if(clientfd[i] > maxfd)
            maxfd = clientfd[i];
        }
        if(poll_client_wr[i] && toc[i]) {
          /* unless told not to do so, monitor writability
             if there is data ready to be sent to client */
          FD_SET(clientfd[i], &output);
          if(clientfd[i] > maxfd)
            maxfd = clientfd[i];
        }
      }
      /* server side socket monitoring */
      if(serverfd[i] != CURL_SOCKET_BAD) {
        if(poll_server_rd[i]) {
          /* unless told not to do so, monitor readability */
          FD_SET(serverfd[i], &input);
          if(serverfd[i] > maxfd)
            maxfd = serverfd[i];
        }
        if(poll_server_wr[i] && tos[i]) {
          /* unless told not to do so, monitor writability
             if there is data ready to be sent to server */
          FD_SET(serverfd[i], &output);
          if(serverfd[i] > maxfd)
            maxfd = serverfd[i];
        }
      }
    }
    if(got_exit_signal)
      break;

    do {
      rc = select((int)maxfd + 1, &input, &output, NULL, &timeout);
    } while(rc < 0 && errno == EINTR && !got_exit_signal);

    if(got_exit_signal)
      break;

    if(rc > 0) {
      /* socket action */
      bool tcp_fin_wr = FALSE;
      timeout_count = 0;

      /* ---------------------------------------------------------- */

      /* passive mode FTP may establish a secondary tunnel */
      if((clientfd[DATA] == CURL_SOCKET_BAD) &&
         (serverfd[DATA] == CURL_SOCKET_BAD) && FD_ISSET(rootfd, &input)) {
        /* a new connection on listener socket (most likely from client) */
        curl_socket_t datafd = accept(rootfd, NULL, NULL);
        if(datafd != CURL_SOCKET_BAD) {
          struct httprequest req2;
          int err = 0;
          memset(&req2, 0, sizeof(req2));
          logmsg("====> Client connect DATA");
#ifdef TCP_NODELAY
          if(socket_domain_is_ip()) {
            /* Disable the Nagle algorithm */
            curl_socklen_t flag = 1;
            if(0 != setsockopt(datafd, IPPROTO_TCP, TCP_NODELAY,
                               (void *)&flag, sizeof(flag)))
              logmsg("====> TCP_NODELAY for client DATA connection failed");
          }
#endif
          req2.pipelining = FALSE;
          init_httprequest(&req2);
          while(!req2.done_processing) {
            err = get_request(datafd, &req2);
            if(err < 0) {
              /* this socket must be closed, done or not */
              break;
            }
          }

          /* skip this and close the socket if err < 0 */
          if(err >= 0) {
            err = send_doc(datafd, &req2);
            if(!err && req2.connect_request) {
              /* sleep to prevent triggering libcurl known bug #39. */
              for(loop = 2; (loop > 0) && !got_exit_signal; loop--)
                wait_ms(250);
              if(!got_exit_signal) {
                /* connect to the server */
                serverfd[DATA] = connect_to(ipaddr, req2.connect_port);
                if(serverfd[DATA] != CURL_SOCKET_BAD) {
                  /* secondary tunnel established, now we have two
                     connections */
                  poll_client_rd[DATA] = TRUE;
                  poll_client_wr[DATA] = TRUE;
                  poll_server_rd[DATA] = TRUE;
                  poll_server_wr[DATA] = TRUE;
                  max_tunnel_idx = DATA;
                  secondary = TRUE;
                  toc[DATA] = 0;
                  tos[DATA] = 0;
                  clientfd[DATA] = datafd;
                  datafd = CURL_SOCKET_BAD;
                }
              }
            }
          }
          if(datafd != CURL_SOCKET_BAD) {
            /* secondary tunnel not established */
            shutdown(datafd, SHUT_RDWR);
            sclose(datafd);
          }
        }
        if(got_exit_signal)
          break;
      }

      /* ---------------------------------------------------------- */

      /* react to tunnel endpoint readable/writable notifications */
      for(i = 0; i <= max_tunnel_idx; i++) {
        size_t len;
        if(clientfd[i] != CURL_SOCKET_BAD) {
          len = sizeof(readclient[i]) - tos[i];
          if(len && FD_ISSET(clientfd[i], &input)) {
            /* read from client */
            rc = sread(clientfd[i], &readclient[i][tos[i]], len);
            if(rc <= 0) {
              logmsg("[%s] got %zd, STOP READING client", data_or_ctrl(i), rc);
              shutdown(clientfd[i], SHUT_RD);
              poll_client_rd[i] = FALSE;
            }
            else {
              logmsg("[%s] READ %zd bytes from client", data_or_ctrl(i), rc);
              logmsg("[%s] READ \"%s\"", data_or_ctrl(i),
                     data_to_hex(&readclient[i][tos[i]], rc));
              tos[i] += rc;
            }
          }
        }
        if(serverfd[i] != CURL_SOCKET_BAD) {
          len = sizeof(readserver[i])-toc[i];
          if(len && FD_ISSET(serverfd[i], &input)) {
            /* read from server */
            rc = sread(serverfd[i], &readserver[i][toc[i]], len);
            if(rc <= 0) {
              logmsg("[%s] got %zd, STOP READING server", data_or_ctrl(i), rc);
              shutdown(serverfd[i], SHUT_RD);
              poll_server_rd[i] = FALSE;
            }
            else {
              logmsg("[%s] READ %zd bytes from server", data_or_ctrl(i), rc);
              logmsg("[%s] READ \"%s\"", data_or_ctrl(i),
                     data_to_hex(&readserver[i][toc[i]], rc));
              toc[i] += rc;
            }
          }
        }
        if(clientfd[i] != CURL_SOCKET_BAD) {
          if(toc[i] && FD_ISSET(clientfd[i], &output)) {
            /* write to client */
            rc = swrite(clientfd[i], readserver[i], toc[i]);
            if(rc <= 0) {
              logmsg("[%s] got %zd, STOP WRITING client", data_or_ctrl(i), rc);
              shutdown(clientfd[i], SHUT_WR);
              poll_client_wr[i] = FALSE;
              tcp_fin_wr = TRUE;
            }
            else {
              logmsg("[%s] SENT %zd bytes to client", data_or_ctrl(i), rc);
              logmsg("[%s] SENT \"%s\"", data_or_ctrl(i),
                     data_to_hex(readserver[i], rc));
              if(toc[i] - rc)
                memmove(&readserver[i][0], &readserver[i][rc], toc[i]-rc);
              toc[i] -= rc;
            }
          }
        }
        if(serverfd[i] != CURL_SOCKET_BAD) {
          if(tos[i] && FD_ISSET(serverfd[i], &output)) {
            /* write to server */
            rc = swrite(serverfd[i], readclient[i], tos[i]);
            if(rc <= 0) {
              logmsg("[%s] got %zd, STOP WRITING server", data_or_ctrl(i), rc);
              shutdown(serverfd[i], SHUT_WR);
              poll_server_wr[i] = FALSE;
              tcp_fin_wr = TRUE;
            }
            else {
              logmsg("[%s] SENT %zd bytes to server", data_or_ctrl(i), rc);
              logmsg("[%s] SENT \"%s\"", data_or_ctrl(i),
                     data_to_hex(readclient[i], rc));
              if(tos[i] - rc)
                memmove(&readclient[i][0], &readclient[i][rc], tos[i]-rc);
              tos[i] -= rc;
            }
          }
        }
      }
      if(got_exit_signal)
        break;

      /* ---------------------------------------------------------- */

      /* endpoint read/write disabling, endpoint closing and tunnel teardown */
      for(i = 0; i <= max_tunnel_idx; i++) {
        for(loop = 2; loop > 0; loop--) {
          /* loop twice to satisfy condition interdependencies without
             having to await select timeout or another socket event */
          if(clientfd[i] != CURL_SOCKET_BAD) {
            if(poll_client_rd[i] && !poll_server_wr[i]) {
              logmsg("[%s] DISABLED READING client", data_or_ctrl(i));
              shutdown(clientfd[i], SHUT_RD);
              poll_client_rd[i] = FALSE;
            }
            if(poll_client_wr[i] && !poll_server_rd[i] && !toc[i]) {
              logmsg("[%s] DISABLED WRITING client", data_or_ctrl(i));
              shutdown(clientfd[i], SHUT_WR);
              poll_client_wr[i] = FALSE;
              tcp_fin_wr = TRUE;
            }
          }
          if(serverfd[i] != CURL_SOCKET_BAD) {
            if(poll_server_rd[i] && !poll_client_wr[i]) {
              logmsg("[%s] DISABLED READING server", data_or_ctrl(i));
              shutdown(serverfd[i], SHUT_RD);
              poll_server_rd[i] = FALSE;
            }
            if(poll_server_wr[i] && !poll_client_rd[i] && !tos[i]) {
              logmsg("[%s] DISABLED WRITING server", data_or_ctrl(i));
              shutdown(serverfd[i], SHUT_WR);
              poll_server_wr[i] = FALSE;
              tcp_fin_wr = TRUE;
            }
          }
        }
      }

      if(tcp_fin_wr)
        /* allow kernel to place FIN bit packet on the wire */
        wait_ms(250);

      /* socket clearing */
      for(i = 0; i <= max_tunnel_idx; i++) {
        for(loop = 2; loop > 0; loop--) {
          if(clientfd[i] != CURL_SOCKET_BAD) {
            if(!poll_client_wr[i] && !poll_client_rd[i]) {
              logmsg("[%s] CLOSING client socket", data_or_ctrl(i));
              sclose(clientfd[i]);
              clientfd[i] = CURL_SOCKET_BAD;
              if(serverfd[i] == CURL_SOCKET_BAD) {
                logmsg("[%s] ENDING", data_or_ctrl(i));
                if(i == DATA)
                  secondary = FALSE;
                else
                  primary = FALSE;
              }
            }
          }
          if(serverfd[i] != CURL_SOCKET_BAD) {
            if(!poll_server_wr[i] && !poll_server_rd[i]) {
              logmsg("[%s] CLOSING server socket", data_or_ctrl(i));
              sclose(serverfd[i]);
              serverfd[i] = CURL_SOCKET_BAD;
              if(clientfd[i] == CURL_SOCKET_BAD) {
                logmsg("[%s] ENDING", data_or_ctrl(i));
                if(i == DATA)
                  secondary = FALSE;
                else
                  primary = FALSE;
              }
            }
          }
        }
      }

      /* ---------------------------------------------------------- */

      max_tunnel_idx = secondary ? DATA : CTRL;

      if(!primary)
        /* exit loop upon primary tunnel teardown */
        break;

    } /* (rc > 0) */
    else {
      timeout_count++;
      if(timeout_count > 5) {
        logmsg("CONNECT proxy timeout after %d idle seconds!", timeout_count);
        break;
      }
    }
  }

http_connect_cleanup:

  for(i = DATA; i >= CTRL; i--) {
    if(serverfd[i] != CURL_SOCKET_BAD) {
      logmsg("[%s] CLOSING server socket (cleanup)", data_or_ctrl(i));
      shutdown(serverfd[i], SHUT_RDWR);
      sclose(serverfd[i]);
    }
    if(clientfd[i] != CURL_SOCKET_BAD) {
      logmsg("[%s] CLOSING client socket (cleanup)", data_or_ctrl(i));
      shutdown(clientfd[i], SHUT_RDWR);
      sclose(clientfd[i]);
    }
    if((serverfd[i] != CURL_SOCKET_BAD) ||
       (clientfd[i] != CURL_SOCKET_BAD)) {
      logmsg("[%s] ABORTING", data_or_ctrl(i));
    }
  }

  *infdp = CURL_SOCKET_BAD;
}